

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

void Kit_SopMakeCubeFree(Kit_Sop_t *cSop)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  
  if ((long)cSop->nCubes < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffff;
    lVar4 = 0;
    do {
      if (cSop->pCubes[lVar4] == 0) break;
      uVar3 = uVar3 & cSop->pCubes[lVar4];
      lVar4 = lVar4 + 1;
    } while (cSop->nCubes != lVar4);
  }
  if ((uVar3 != 0) && (0 < cSop->nCubes)) {
    puVar2 = cSop->pCubes;
    lVar4 = 0;
    do {
      uVar1 = puVar2[lVar4];
      if (uVar1 == 0) {
        return;
      }
      puVar2[lVar4] = uVar1 & ~uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < cSop->nCubes);
  }
  return;
}

Assistant:

void Kit_SopMakeCubeFree( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = Kit_SopCommonCube( cSop );
    if ( uMask == 0 )
        return;
    // remove the common cube
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopWriteCube( cSop, Kit_CubeSharp(uCube, uMask), i );
}